

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-extra-test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_3ac2::OutputRedirectTest_FlushErrorInRestoreAndRead_Test::TestBody
          (OutputRedirectTest_FlushErrorInRestoreAndRead_Test *this)

{
  file __fd;
  bool bVar1;
  int __fd2;
  char *pcVar2;
  string_view message;
  file write_end;
  file write_copy;
  AssertionResult gtest_ar_1;
  file read_end;
  buffered_file f;
  AssertionResult gtest_ar;
  OutputRedirect redir;
  AssertHelper local_a0;
  file local_98;
  file local_94;
  AssertionResult local_90;
  file local_7c;
  buffered_file local_78;
  string local_70;
  OutputRedirect local_50;
  string local_40;
  
  local_7c.fd_ = -1;
  local_98.fd_ = -1;
  fmt::v5::file::pipe(&local_7c,&local_98.fd_);
  __fd.fd_ = local_98.fd_;
  fmt::v5::file::dup(&local_94,local_98.fd_);
  fmt::v5::file::fdopen((file *)&local_78,(int)&local_98,"w");
  OutputRedirect::OutputRedirect(&local_50,local_78.file_);
  local_a0.data_._0_1_ = 0x78;
  local_90._0_4_ = fputc(0x78,(FILE *)local_78.file_);
  testing::internal::CmpHelperEQ<char,int>
            ((internal *)&local_70,"\'x\'","fputc(\'x\', f.get())",(char *)&local_a0,
             (int *)&local_90);
  if ((char)local_70._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_90);
    if ((undefined8 *)local_70._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_70._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/gtest-extra-test.cc"
               ,0x180,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_90._0_8_ + 8))();
      }
      local_90._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_70._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  close(__fd.fd_);
  testing::AssertionSuccess();
  if (local_90.success_ == true) {
    message.size_ = 0x13;
    message.data_ = "cannot flush stream";
    format_system_error_abi_cxx11_(&local_70,9,message);
    bVar1 = testing::internal::AlwaysTrue();
    if ((bVar1) &&
       (OutputRedirect::restore_and_read_abi_cxx11_(&local_40,&local_50),
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_40._M_dataplus._M_p != &local_40.field_2)) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    testing::AssertionResult::operator<<
              (&local_90,
               (char (*) [111])
               "Expected: redir.restore_and_read() throws an exception of type fmt::system_error.\n  Actual: it throws nothing."
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  testing::Message::Message((Message *)&local_70);
  if (local_90.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_90.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_a0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/gtest-extra-test.cc"
             ,0x183,pcVar2);
  testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_70);
  testing::internal::AssertHelper::~AssertHelper(&local_a0);
  if ((long *)local_70._M_dataplus._M_p != (long *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && ((long *)local_70._M_dataplus._M_p != (long *)0x0)) {
      (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
    }
    local_70._M_dataplus._M_p = (pointer)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_90.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  fmt::v5::file::dup2(&local_94,__fd.fd_,__fd2);
  OutputRedirect::~OutputRedirect(&local_50);
  fmt::v5::buffered_file::~buffered_file(&local_78);
  fmt::v5::file::~file(&local_94);
  fmt::v5::file::~file(&local_98);
  fmt::v5::file::~file(&local_7c);
  return;
}

Assistant:

TEST(OutputRedirectTest, FlushErrorInRestoreAndRead) {
  file read_end, write_end;
  file::pipe(read_end, write_end);
  int write_fd = write_end.descriptor();
  file write_copy = write_end.dup(write_fd);
  buffered_file f = write_end.fdopen("w");
  OutputRedirect redir(f.get());
  // Put a character in a file buffer.
  EXPECT_EQ('x', fputc('x', f.get()));
  FMT_POSIX(close(write_fd));
  EXPECT_SYSTEM_ERROR_NOASSERT(redir.restore_and_read(),
      EBADF, "cannot flush stream");
  write_copy.dup2(write_fd);  // "undo" close or dtor will fail
}